

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetNullCompositeConstant(ConstantManager *this,Type *type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Constant *pCVar2;
  bool bVar3;
  uint32_t null_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words_or_id;
  uint32_t local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*type->_vptr_Type[0xe])(type);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*type->_vptr_Type[0x10])(type);
    if (CONCAT44(extraout_var_02,iVar1) == 0) {
      iVar1 = (*type->_vptr_Type[0x1c])(type);
      if (CONCAT44(extraout_var_05,iVar1) == 0) {
        iVar1 = (*type->_vptr_Type[0x18])(type);
        if (CONCAT44(extraout_var_06,iVar1) != 0) {
          iVar1 = (*type->_vptr_Type[0x18])(type);
          local_4c = GetNullConstId(this,*(Type **)(CONCAT44(extraout_var_07,iVar1) + 0x28));
          iVar1 = (*type->_vptr_Type[0x18])(type);
          if (**(int **)(CONCAT44(extraout_var_08,iVar1) + 0x38) != 0) {
            __assert_fail("type->AsArray()->length_info().words[0] == analysis::Array::LengthInfo::kConstant && \"unexpected array length\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                          ,0x1a2,
                          "const Constant *spvtools::opt::analysis::ConstantManager::GetNullCompositeConstant(const Type *)"
                         );
          }
          iVar1 = (*type->_vptr_Type[0x18])(type);
          iVar1 = **(int **)(CONCAT44(extraout_var_09,iVar1) + 0x38);
          while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
          }
          goto LAB_001c4a67;
        }
      }
      pCVar2 = (Constant *)0x0;
      goto LAB_001c4a7a;
    }
    iVar1 = (*type->_vptr_Type[0x10])();
    local_4c = GetNullConstId(this,*(Type **)(CONCAT44(extraout_var_03,iVar1) + 0x28));
    iVar1 = (*type->_vptr_Type[0x10])(type);
    iVar1 = *(int *)(CONCAT44(extraout_var_04,iVar1) + 0x30);
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
  }
  else {
    iVar1 = (*type->_vptr_Type[0xe])();
    local_4c = GetNullConstId(this,*(Type **)(CONCAT44(extraout_var_00,iVar1) + 0x28));
    iVar1 = (*type->_vptr_Type[0xe])(type);
    iVar1 = *(int *)(CONCAT44(extraout_var_01,iVar1) + 0x30);
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
  }
LAB_001c4a67:
  pCVar2 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
LAB_001c4a7a:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return pCVar2;
}

Assistant:

const Constant* ConstantManager::GetNullCompositeConstant(const Type* type) {
  std::vector<uint32_t> literal_words_or_id;

  if (type->AsVector()) {
    const Type* element_type = type->AsVector()->element_type();
    const uint32_t null_id = GetNullConstId(element_type);
    const uint32_t element_count = type->AsVector()->element_count();
    for (uint32_t i = 0; i < element_count; i++) {
      literal_words_or_id.push_back(null_id);
    }
  } else if (type->AsMatrix()) {
    const Type* element_type = type->AsMatrix()->element_type();
    const uint32_t null_id = GetNullConstId(element_type);
    const uint32_t element_count = type->AsMatrix()->element_count();
    for (uint32_t i = 0; i < element_count; i++) {
      literal_words_or_id.push_back(null_id);
    }
  } else if (type->AsStruct()) {
    // TODO (sfricke-lunarg) add proper struct support
    return nullptr;
  } else if (type->AsArray()) {
    const Type* element_type = type->AsArray()->element_type();
    const uint32_t null_id = GetNullConstId(element_type);
    assert(type->AsArray()->length_info().words[0] ==
               analysis::Array::LengthInfo::kConstant &&
           "unexpected array length");
    const uint32_t element_count = type->AsArray()->length_info().words[0];
    for (uint32_t i = 0; i < element_count; i++) {
      literal_words_or_id.push_back(null_id);
    }
  } else {
    return nullptr;
  }

  return GetConstant(type, literal_words_or_id);
}